

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O0

bool duckdb::TryDecimalStringCast<long,(char)46>
               (char *string_ptr,idx_t string_size,long *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  bool bVar1;
  char *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  undefined4 in_R8D;
  string error;
  string_t value;
  DecimalCastData<long> state;
  DecimalCastData<long> *in_stack_ffffffffffffff08;
  CastParameters *parameters_00;
  undefined4 in_stack_ffffffffffffff10;
  uint32_t len;
  string_t *in_stack_ffffffffffffff30;
  string_t *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string local_78 [48];
  undefined8 local_48;
  byte local_40;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  byte local_29;
  undefined8 *local_20;
  byte local_1;
  
  local_40 = (byte)in_R8D;
  local_48 = 0;
  local_3e = 0;
  local_3d = 0;
  local_3a = 0;
  local_39 = 0;
  local_3c = 0;
  local_3b = 0;
  local_29 = local_40;
  local_20 = in_RDX;
  local_38 = UnsafeNumericCast<long,long,void>
                       (*(long *)(NumericHelper::POWERS_OF_TEN + (ulong)local_40 * 8));
  len = (uint32_t)((ulong)in_RDX >> 0x20);
  bVar1 = TryIntegerCast<duckdb::DecimalCastData<long>,true,true,duckdb::DecimalCastOperation,false,(char)46>
                    (in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08,
                     false);
  if (bVar1) {
    *local_20 = local_48;
    local_1 = 1;
  }
  else {
    string_t::string_t(in_stack_ffffffffffffff30,in_RSI,len);
    parameters_00 = (CastParameters *)&stack0xffffffffffffff67;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff68,
               "Could not convert string \"%s\" to DECIMAL(%d,%d)",(allocator *)parameters_00);
    string_t::GetString_abi_cxx11_(in_stack_ffffffffffffff48);
    StringUtil::Format<std::__cxx11::string,int,int>
              (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff58);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    HandleCastError::AssignError((string *)CONCAT44(in_R8D,in_stack_ffffffffffffff10),parameters_00)
    ;
    local_1 = 0;
    ::std::__cxx11::string::~string(local_78);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}